

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplicationExpression.cpp
# Opt level: O0

void __thiscall
ninx::parser::element::MultiplicationExpression::MultiplicationExpression
          (MultiplicationExpression *this,
          unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
          *first,unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *second)

{
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_30;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_28;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  *local_20;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  *second_local;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  *first_local;
  MultiplicationExpression *this_local;
  
  local_20 = second;
  second_local = first;
  first_local = (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)this;
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::unique_ptr(&local_28,first);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::unique_ptr(&local_30,second);
  BinaryExpression::BinaryExpression(&this->super_BinaryExpression,&local_28,&local_30);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr(&local_30);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr(&local_28);
  (this->super_BinaryExpression).super_Expression.super_Statement.super_ASTElement._vptr_ASTElement
       = (_func_int **)&PTR__MultiplicationExpression_002890c0;
  return;
}

Assistant:

ninx::parser::element::MultiplicationExpression::MultiplicationExpression(std::unique_ptr<ninx::parser::element::Expression> first,
                                                    std::unique_ptr<ninx::parser::element::Expression> second)
        : BinaryExpression(std::move(first), std::move(second)) {


}